

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::Reject
               (bool throwOnError,ScriptContext *scriptContext,int32 errorCode,PropertyId propertyId
               )

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ThreadContext *this;
  PropertyRecord *this_00;
  char16 *varName;
  PropertyId propertyId_local;
  int32 errorCode_local;
  ScriptContext *scriptContext_local;
  bool throwOnError_local;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x2693,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (throwOnError) {
    this = ScriptContext::GetThreadContext(scriptContext);
    this_00 = ThreadContext::GetPropertyName(this,propertyId);
    varName = PropertyRecord::GetBuffer(this_00);
    JavascriptError::ThrowTypeError(scriptContext,errorCode,varName);
  }
  return 0;
}

Assistant:

BOOL JavascriptOperators::Reject(bool throwOnError, ScriptContext* scriptContext, int32 errorCode, PropertyId propertyId)
    {
        Assert(scriptContext);

        if (throwOnError)
        {
            JavascriptError::ThrowTypeError(scriptContext, errorCode, scriptContext->GetThreadContext()->GetPropertyName(propertyId)->GetBuffer());
        }
        return FALSE;
    }